

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int ON_StringCompareOrdinalUTF8
              (char *string1,int element_count1,char *string2,int element_count2,
              bool bOrdinalIgnoreCase)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint local_44;
  int local_3c;
  int element_count;
  int i;
  uint c2;
  uint c1;
  char null_terminator;
  bool bOrdinalIgnoreCase_local;
  byte *pbStack_28;
  int element_count2_local;
  char *string2_local;
  byte *pbStack_18;
  int element_count1_local;
  char *string1_local;
  
  if (((string1 == (char *)0x0) && (element_count1 != 0)) ||
     ((string2 == (char *)0x0 && (element_count2 != 0)))) {
    if (string1 == string2) {
      return 0;
    }
    if (string1 == (char *)0x0) {
      return -1;
    }
    if (string2 == (char *)0x0) {
      return 1;
    }
  }
  c2._2_1_ = 0;
  c2._3_1_ = bOrdinalIgnoreCase;
  c1 = element_count2;
  pbStack_28 = (byte *)string2;
  string2_local._4_4_ = element_count1;
  pbStack_18 = (byte *)string1;
  if (element_count1 < 0) {
    string2_local._4_4_ = ON_String::Length(string1);
  }
  if ((int)c1 < 0) {
    c1 = ON_String::Length((char *)pbStack_28);
  }
  if (string2_local._4_4_ == 0) {
    pbStack_18 = (byte *)((long)&c2 + 2);
  }
  if (c1 == 0) {
    pbStack_28 = (byte *)((long)&c2 + 2);
  }
  if ((pbStack_18 != pbStack_28) || (string2_local._4_4_ != c1)) {
    if ((int)c1 < (int)string2_local._4_4_) {
      local_44 = c1;
    }
    else {
      local_44 = string2_local._4_4_;
    }
    if ((c2._3_1_ & 1) == 0) {
      for (local_3c = 0; local_3c < (int)local_44; local_3c = local_3c + 1) {
        if (*pbStack_18 < *pbStack_28) {
          return -1;
        }
        if (*pbStack_28 < *pbStack_18) {
          return 1;
        }
        pbStack_28 = pbStack_28 + 1;
        pbStack_18 = pbStack_18 + 1;
      }
    }
    else {
      for (local_3c = 0; local_3c < (int)local_44; local_3c = local_3c + 1) {
        bVar1 = *pbStack_18;
        pbStack_18 = pbStack_18 + 1;
        uVar2 = OrdinalUTF8ToIgnoreCase(bVar1);
        bVar1 = *pbStack_28;
        pbStack_28 = pbStack_28 + 1;
        uVar3 = OrdinalUTF8ToIgnoreCase(bVar1);
        if (uVar2 < uVar3) {
          return -1;
        }
        if (uVar3 < uVar2) {
          return 1;
        }
      }
    }
    for (; local_3c < (int)string2_local._4_4_; local_3c = local_3c + 1) {
      if (*pbStack_18 != 0) {
        return 1;
      }
      pbStack_18 = pbStack_18 + 1;
    }
    for (; local_3c < (int)c1; local_3c = local_3c + 1) {
      if (*pbStack_28 != 0) {
        return -1;
      }
      pbStack_28 = pbStack_28 + 1;
    }
  }
  return 0;
}

Assistant:

int ON_StringCompareOrdinalUTF8(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(char,ON_String::Length,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (unsigned char)(*string1++);
      c2 = (unsigned char)(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return 1;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return -1;
  }

  return 0;
}

int ON_StringCompareOrdinalUTF16(
  const ON__UINT16* string1,
  int element_count1,
  const ON__UINT16* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(ON__UINT16,ON_StringLengthUTF16,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF16ToIgnoreCase(*string1++);
      c2 = OrdinalUTF16ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (*string1++);
      c2 = (*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return 1;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return -1;
  }

  return 0;
}

int ON_StringCompareOrdinalUTF32(
  const ON__UINT32* string1,
  int element_count1,
  const ON__UINT32* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(ON__UINT32,ON_StringLengthUTF32,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF32ToIgnoreCase(*string1++);
      c2 = OrdinalUTF32ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (*string1++);
      c2 = (*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }